

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.cc
# Opt level: O1

string * __thiscall
google::protobuf::compiler::cpp::ClassName_abi_cxx11_
          (string *__return_storage_ptr__,cpp *this,EnumDescriptor *enum_descriptor)

{
  string_view name;
  _Alloc_hider in_stack_ffffffffffffff38;
  char *in_stack_ffffffffffffff40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  undefined8 local_a8;
  undefined8 local_a0;
  AlphaNum local_78;
  AlphaNum local_48;
  
  if (*(cpp **)(this + 0x18) == (cpp *)0x0) {
    name._M_str = in_stack_ffffffffffffff40;
    name._M_len = (size_t)in_stack_ffffffffffffff38._M_p;
    ResolveKeyword_abi_cxx11_(name);
  }
  else {
    ClassName_abi_cxx11_
              ((string *)&stack0xffffffffffffff38,*(cpp **)(this + 0x18),
               (Descriptor *)enum_descriptor);
    local_78.piece_._M_len = 1;
    local_78.piece_._M_str = "_";
    local_a0 = **(undefined8 **)(this + 8);
    local_a8 = (*(undefined8 **)(this + 8))[1];
    absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)__return_storage_ptr__,&local_48,&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)in_stack_ffffffffffffff38._M_p != &local_b8) {
      operator_delete(in_stack_ffffffffffffff38._M_p,local_b8._M_allocated_capacity + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ClassName(const EnumDescriptor* enum_descriptor) {
  if (enum_descriptor->containing_type() == nullptr) {
    return ResolveKeyword(enum_descriptor->name());
  } else {
    return absl::StrCat(ClassName(enum_descriptor->containing_type()), "_",
                        enum_descriptor->name());
  }
}